

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O0

void __thiscall Assimp::LWO::Layer::Layer(Layer *this,Layer *param_1)

{
  uint uVar1;
  uint16_t uVar2;
  float fVar3;
  Layer *param_1_local;
  Layer *this_local;
  
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&this->mTempPoints,&param_1->mTempPoints);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->mPointReferrers,&param_1->mPointReferrers);
  std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>::vector
            (&this->mWeightChannels,&param_1->mWeightChannels);
  std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>::vector
            (&this->mSWeightChannels,&param_1->mSWeightChannels);
  std::vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>::vector
            (&this->mVColorChannels,&param_1->mVColorChannels);
  std::vector<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>::vector
            (&this->mUVChannels,&param_1->mUVChannels);
  NormalChannel::NormalChannel(&this->mNormals,&param_1->mNormals);
  std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::vector
            (&this->mFaces,&param_1->mFaces);
  uVar1 = param_1->mPointIDXOfs;
  this->mFaceIDXOfs = param_1->mFaceIDXOfs;
  this->mPointIDXOfs = uVar1;
  uVar2 = param_1->mIndex;
  this->mParent = param_1->mParent;
  this->mIndex = uVar2;
  std::__cxx11::string::string((string *)&this->mName,(string *)&param_1->mName);
  fVar3 = (param_1->mPivot).y;
  (this->mPivot).x = (param_1->mPivot).x;
  (this->mPivot).y = fVar3;
  (this->mPivot).z = (param_1->mPivot).z;
  this->skip = param_1->skip;
  return;
}

Assistant:

Layer()
        : mFaceIDXOfs   (0)
        , mPointIDXOfs  (0)
        , mParent       (0x0)
        , mIndex        (0xffff)
        , skip          (false)
    {}